

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::SmoothF0Contour(double *f0,int f0_length,double *smoothed_f0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int number_of_boundaries_00;
  ulong uVar6;
  double *f0_00;
  double *a_00;
  double **multi_channel_f0_00;
  double *pdVar7;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int i_5;
  int j;
  int i_4;
  int i_3;
  double **multi_channel_f0;
  int number_of_boundaries;
  int *boundary_list;
  int i_2;
  int i_1;
  int i;
  double *f0_contour;
  int new_f0_length;
  int lag;
  double a [2];
  double b [2];
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int x_length;
  undefined4 in_stack_ffffffffffffff98;
  int local_54;
  int iVar8;
  int iVar9;
  
  iVar5 = in_ESI + 600;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  f0_00 = (double *)operator_new__(uVar6);
  for (iVar9 = 0; iVar9 < 300; iVar9 = iVar9 + 1) {
    f0_00[iVar9] = 0.0;
  }
  for (iVar8 = 300; iVar8 < in_ESI + 300; iVar8 = iVar8 + 1) {
    f0_00[iVar8] = *(double *)(in_RDI + (long)(iVar8 + -300) * 8);
  }
  for (local_54 = in_ESI + 300; local_54 < iVar5; local_54 = local_54 + 1) {
    f0_00[local_54] = 0.0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  a_00 = (double *)operator_new__(uVar6);
  number_of_boundaries_00 =
       GetBoundaryList((double *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c,
                       (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(number_of_boundaries_00 / 2);
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  multi_channel_f0_00 = (double **)operator_new__(uVar6);
  for (x_length = 0; x_length < number_of_boundaries_00 / 2; x_length = x_length + 1) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)iVar5;
    uVar6 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pdVar7 = (double *)operator_new__(uVar6);
    multi_channel_f0_00[x_length] = pdVar7;
  }
  GetMultiChannelF0(f0_00,iVar5,(int *)a_00,number_of_boundaries_00,multi_channel_f0_00);
  for (iVar5 = 0; iVar5 < number_of_boundaries_00 / 2; iVar5 = iVar5 + 1) {
    FilteringF0(a_00,(double *)CONCAT44(number_of_boundaries_00,in_stack_ffffffffffffff98),
                (double *)multi_channel_f0_00,x_length,iVar5,in_stack_ffffffffffffff84,
                (double *)CONCAT44(iVar9,iVar8));
    for (in_stack_ffffffffffffff84 = *(int *)((long)a_00 + (long)(iVar5 << 1) * 4);
        in_stack_ffffffffffffff84 <= *(int *)((long)a_00 + (long)(iVar5 * 2 + 1) * 4);
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
      *(double *)(in_RDX + (long)(in_stack_ffffffffffffff84 + -300) * 8) =
           f0_00[in_stack_ffffffffffffff84];
    }
  }
  for (iVar5 = 0; iVar5 < number_of_boundaries_00 / 2; iVar5 = iVar5 + 1) {
    if (multi_channel_f0_00[iVar5] != (double *)0x0) {
      operator_delete__(multi_channel_f0_00[iVar5]);
    }
  }
  if (multi_channel_f0_00 != (double **)0x0) {
    operator_delete__(multi_channel_f0_00);
  }
  if (f0_00 != (double *)0x0) {
    operator_delete__(f0_00);
  }
  if (a_00 != (double *)0x0) {
    operator_delete__(a_00);
  }
  return;
}

Assistant:

static void SmoothF0Contour(const double *f0, int f0_length,
    double *smoothed_f0) {
  const double b[2] =
    { 0.0078202080334971724, 0.015640416066994345 };
  const double a[2] =
    { 1.7347257688092754, -0.76600660094326412 };
  int lag = 300;
  int new_f0_length = f0_length + lag * 2;
  double *f0_contour = new double[new_f0_length];
  for (int i = 0; i < lag; ++i) f0_contour[i] = 0.0;
  for (int i = lag; i < lag + f0_length; ++i) f0_contour[i] = f0[i - lag];
  for (int i = lag + f0_length; i < new_f0_length; ++i) f0_contour[i] = 0.0;

  int *boundary_list = new int[new_f0_length];
  int number_of_boundaries =
    GetBoundaryList(f0_contour, new_f0_length, boundary_list);
  double **multi_channel_f0 = new double *[number_of_boundaries / 2];
  for (int i = 0; i < number_of_boundaries / 2; ++i)
    multi_channel_f0[i] = new double[new_f0_length];
  GetMultiChannelF0(f0_contour, new_f0_length, boundary_list,
      number_of_boundaries, multi_channel_f0);

  for (int i = 0; i < number_of_boundaries / 2; ++i) {
    FilteringF0(a, b, multi_channel_f0[i], new_f0_length,
      boundary_list[i * 2], boundary_list[i * 2 + 1], f0_contour);
    for (int j = boundary_list[i * 2]; j <= boundary_list[i * 2 + 1]; ++j)
      smoothed_f0[j - lag] = f0_contour[j];
  }

  for (int i = 0; i < number_of_boundaries / 2; ++i)
    delete[] multi_channel_f0[i];
  delete[] multi_channel_f0;
  delete[] f0_contour;
  delete[] boundary_list;
}